

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O0

Result __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::removeRowSingleton
          (SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *lp,
          SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *row,int *i)

{
  bool bVar1;
  type_conflict5 tVar2;
  char *pcVar3;
  ulong *puVar4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar5;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar6;
  int *piVar7;
  int *in_RCX;
  int __c;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDX;
  long *in_RSI;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  oldUp;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  oldLo;
  bool stricterLo;
  bool stricterUp;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  up;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lo;
  int j;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  aij;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_3;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_3;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  cpp_dec_float<50U,_int,_void> *in_stack_fffffffffffff1a8;
  int i_00;
  RowSingletonPS *__p;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff1b0;
  Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
  *this_00;
  double in_stack_fffffffffffff1b8;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *lp_00;
  cpp_dec_float<50U,_int,_void> *in_stack_fffffffffffff1c0;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_01;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff1e0;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff1e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff1f0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff218;
  undefined7 in_stack_fffffffffffff220;
  undefined1 in_stack_fffffffffffff227;
  bool bVar8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff228;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff230;
  cpp_dec_float<50U,_int,_void> *in_stack_fffffffffffff238;
  undefined7 in_stack_fffffffffffff260;
  undefined1 in_stack_fffffffffffff267;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff268;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff270;
  undefined1 in_stack_fffffffffffff28e;
  undefined1 in_stack_fffffffffffff28f;
  int in_stack_fffffffffffff290;
  TYPE in_stack_fffffffffffff294;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff298;
  RowSingletonPS *in_stack_fffffffffffff2a0;
  Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
  local_d14 [2];
  undefined1 local_cd0 [16];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff340;
  element_type *in_stack_fffffffffffff348;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffff350;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff358;
  shared_ptr<soplex::Tolerances> *in_stack_fffffffffffff360;
  undefined1 local_c4c [56];
  undefined1 local_c14 [112];
  undefined1 local_ba4 [56];
  undefined1 local_b6c [56];
  undefined1 local_b34 [56];
  undefined1 local_afc [58];
  undefined1 local_ac2;
  undefined1 local_ac1;
  undefined8 local_ac0 [8];
  undefined1 local_a80 [56];
  undefined8 local_a48 [8];
  undefined1 local_a08 [112];
  undefined8 local_998;
  undefined1 local_990 [56];
  undefined1 local_958 [112];
  undefined8 local_8e8;
  undefined1 local_8e0 [56];
  undefined1 local_8a8 [56];
  ulong local_870;
  undefined1 local_868 [56];
  undefined1 local_830 [56];
  ulong local_7f8;
  undefined1 local_7f0 [56];
  undefined1 local_7b8 [112];
  undefined8 local_748;
  undefined1 local_740 [56];
  undefined1 local_708 [56];
  undefined1 local_6d0 [56];
  undefined1 local_698 [56];
  ulong local_660;
  ulong local_658;
  undefined1 local_650 [56];
  undefined1 local_618 [112];
  undefined8 local_5a8;
  undefined1 local_5a0 [56];
  undefined1 local_568 [56];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_530;
  ulong local_4f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4ec;
  undefined4 local_4b4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4b0;
  int *local_478;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_470;
  long *local_468;
  Result local_454;
  undefined8 local_450;
  ulong *local_448;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_440;
  undefined8 local_438;
  undefined8 local_430;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_428;
  undefined8 local_420;
  undefined8 *local_418;
  undefined1 *local_410;
  undefined8 local_408;
  ulong *local_400;
  undefined1 *local_3f8;
  undefined8 local_3f0;
  ulong *local_3e8;
  undefined1 *local_3e0;
  undefined8 local_3d8;
  undefined8 local_3d0;
  undefined1 *local_3c8;
  undefined8 local_3c0;
  undefined8 local_3b8;
  undefined1 *local_3b0;
  undefined8 local_3a8;
  undefined8 *local_3a0;
  undefined1 *local_398;
  undefined8 local_390;
  undefined8 local_388;
  undefined1 *local_380;
  undefined8 local_378;
  ulong *local_370;
  undefined1 *local_368;
  undefined8 local_360;
  ulong *local_358;
  undefined1 *local_350;
  undefined8 local_348;
  undefined8 local_340;
  undefined1 *local_338;
  undefined8 local_330;
  undefined8 *local_328;
  undefined1 *local_320;
  undefined8 local_318;
  undefined8 *local_310;
  undefined1 *local_308;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_300;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2f0;
  undefined1 *local_2e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2e0;
  undefined1 *local_2d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2d0;
  undefined1 *local_2c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2c0;
  undefined1 *local_2b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2b0;
  undefined1 *local_2a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2a0;
  undefined1 *local_298;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_290;
  undefined1 *local_288;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_280;
  undefined1 *local_278;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_270;
  undefined1 *local_268;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_260;
  undefined1 *local_258;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_250;
  undefined1 *local_248;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_240;
  undefined1 *local_238;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_230;
  undefined1 *local_228;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_220;
  Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
  *local_218;
  undefined1 *local_210;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_208;
  undefined1 *local_200;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_1f8;
  undefined1 *local_1f0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1e8;
  undefined1 *local_1e0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1d8;
  undefined1 *local_1d0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1c8;
  undefined1 *local_1c0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1b8;
  undefined8 *local_1b0;
  undefined8 *local_1a8;
  undefined8 local_1a0;
  ulong *local_198;
  ulong *local_190;
  undefined8 local_188;
  undefined8 *local_180;
  undefined8 local_178;
  undefined8 local_170;
  ulong *local_168;
  ulong *local_160;
  undefined8 *local_158;
  undefined8 local_150;
  ulong *local_148;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_139;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_138;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_118;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_110;
  undefined1 *local_108;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_f9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d0;
  undefined1 *local_c8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_b9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_98;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_90;
  undefined1 *local_88;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_79;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_78;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_50;
  undefined1 *local_48;
  undefined8 *local_40;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  undefined8 *local_30;
  undefined8 *local_28;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_20;
  undefined8 *local_18;
  
  local_478 = in_RCX;
  local_470 = in_RDX;
  local_468 = in_RSI;
  local_300 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::value(in_RDX,0);
  local_2f8 = &local_4b0;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff1b0,in_stack_fffffffffffff1a8);
  pcVar3 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ::index(local_470,(char *)0x0,__c);
  local_4b4 = SUB84(pcVar3,0);
  puVar4 = (ulong *)infinity();
  local_4f8 = *puVar4 ^ 0x8000000000000000;
  local_440 = &local_4ec;
  local_448 = &local_4f8;
  local_450 = 0;
  local_148 = local_448;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0);
  local_430 = infinity();
  local_428 = &local_530;
  local_438 = 0;
  local_150 = local_430;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0);
  pnVar5 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ::lhs(in_stack_fffffffffffff1b0,(int)((ulong)in_stack_fffffffffffff1a8 >> 0x20));
  pnVar6 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ::rhs(in_stack_fffffffffffff1b0,(int)((ulong)in_stack_fffffffffffff1a8 >> 0x20));
  SPxOut::
  debug<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[51],_int_&,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_&,_const_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_&,_const_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_&,_0>
            (in_RDI,(char (*) [51])"IMAISM22 row {}: singleton -> val={} lhs={} rhs={}",local_478,
             &local_4b0,pnVar5,pnVar6);
  local_2e8 = local_568;
  local_2f0 = &local_4b0;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff1b0,in_stack_fffffffffffff1a8);
  local_5a8 = 0;
  local_410 = local_5a0;
  local_418 = &local_5a8;
  local_420 = 0;
  local_158 = local_418;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0);
  epsZero(in_stack_fffffffffffff1e8);
  bVar1 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (in_stack_fffffffffffff1f0,
                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)in_stack_fffffffffffff1e8,in_stack_fffffffffffff1e0);
  if (bVar1) {
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::lhs(in_stack_fffffffffffff1b0,(int)((ulong)in_stack_fffffffffffff1a8 >> 0x20));
    puVar4 = (ulong *)infinity();
    local_658 = *puVar4 ^ 0x8000000000000000;
    local_3f8 = local_650;
    local_400 = &local_658;
    local_408 = 0;
    local_160 = local_400;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0);
    tVar2 = boost::multiprecision::operator<=
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffff1a8,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x424bf4);
    if (tVar2) {
      puVar4 = (ulong *)infinity();
      local_660 = *puVar4 ^ 0x8000000000000000;
      local_3e0 = local_618;
      local_3e8 = &local_660;
      local_3f0 = 0;
      local_168 = local_3e8;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0);
    }
    else {
      local_70 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::lhs(in_stack_fffffffffffff1b0,(int)((ulong)in_stack_fffffffffffff1a8 >> 0x20));
      local_68 = local_618;
      local_78 = &local_4b0;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_79,local_70,local_78);
      local_60 = local_618;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff1b0);
      local_48 = local_618;
      local_50 = local_70;
      local_58 = local_78;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff1b0,
                 in_stack_fffffffffffff1a8,(cpp_dec_float<50U,_int,_void> *)0x424d4a);
    }
    local_1b8 = &local_4ec;
    local_1c0 = local_618;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff1b0,in_stack_fffffffffffff1a8)
    ;
    in_stack_fffffffffffff238 =
         &SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::rhs(in_stack_fffffffffffff1b0,(int)((ulong)in_stack_fffffffffffff1a8 >> 0x20))->
          m_backend;
    local_3d0 = infinity();
    local_3c8 = local_6d0;
    local_3d8 = 0;
    local_170 = local_3d0;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0);
    tVar2 = boost::multiprecision::operator>=
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_fffffffffffff1a8,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x424e09);
    if (tVar2) {
      local_3b8 = infinity();
      local_3b0 = local_698;
      local_3c0 = 0;
      local_178 = local_3b8;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0);
    }
    else {
      local_b0 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::rhs(in_stack_fffffffffffff1b0,(int)((ulong)in_stack_fffffffffffff1a8 >> 0x20));
      local_a8 = local_698;
      local_b8 = &local_4b0;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_b9,local_b0,local_b8);
      local_a0 = local_698;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff1b0);
      local_88 = local_698;
      local_90 = local_b0;
      local_98 = local_b8;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff1b0,
                 in_stack_fffffffffffff1a8,(cpp_dec_float<50U,_int,_void> *)0x424f30);
    }
    local_1c8 = &local_530;
    local_1d0 = local_698;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff1b0,in_stack_fffffffffffff1a8)
    ;
  }
  else {
    local_2d8 = local_708;
    local_2e0 = &local_4b0;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff1b0,in_stack_fffffffffffff1a8)
    ;
    local_748 = 0;
    local_398 = local_740;
    local_3a0 = &local_748;
    local_3a8 = 0;
    local_180 = local_3a0;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0);
    epsZero(in_stack_fffffffffffff1e8);
    bVar1 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (in_stack_fffffffffffff230,in_stack_fffffffffffff228,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220));
    i_00 = (int)((ulong)in_stack_fffffffffffff1a8 >> 0x20);
    if (bVar1) {
      in_stack_fffffffffffff230 =
           SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ::rhs(in_stack_fffffffffffff1b0,i_00);
      local_388 = infinity();
      local_380 = local_7f0;
      local_390 = 0;
      local_188 = local_388;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0);
      tVar2 = boost::multiprecision::operator>=
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_fffffffffffff1a8,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x4250c9);
      if (tVar2) {
        puVar4 = (ulong *)infinity();
        local_7f8 = *puVar4 ^ 0x8000000000000000;
        local_368 = local_7b8;
        local_370 = &local_7f8;
        local_378 = 0;
        local_190 = local_370;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  (in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0);
      }
      else {
        local_f0 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::rhs(in_stack_fffffffffffff1b0,(int)((ulong)in_stack_fffffffffffff1a8 >> 0x20));
        local_e8 = local_7b8;
        local_f8 = &local_4b0;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_f9,local_f0,local_f8);
        local_e0 = local_7b8;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff1b0);
        local_c8 = local_7b8;
        local_d0 = local_f0;
        local_d8 = local_f8;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff1b0,
                   in_stack_fffffffffffff1a8,(cpp_dec_float<50U,_int,_void> *)0x42521f);
      }
      local_1d8 = &local_4ec;
      local_1e0 = local_7b8;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff1b0,
                 in_stack_fffffffffffff1a8);
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::lhs(in_stack_fffffffffffff1b0,(int)((ulong)in_stack_fffffffffffff1a8 >> 0x20));
      puVar4 = (ulong *)infinity();
      local_870 = *puVar4 ^ 0x8000000000000000;
      local_350 = local_868;
      local_358 = &local_870;
      local_360 = 0;
      local_198 = local_358;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0);
      tVar2 = boost::multiprecision::operator<=
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_fffffffffffff1a8,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x42530a);
      if (tVar2) {
        local_340 = infinity();
        local_338 = local_830;
        local_348 = 0;
        local_1a0 = local_340;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  (in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0);
      }
      else {
        local_130 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::lhs(in_stack_fffffffffffff1b0,(int)((ulong)in_stack_fffffffffffff1a8 >> 0x20))
        ;
        local_128 = local_830;
        local_138 = &local_4b0;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_139,local_130,local_138);
        local_120 = local_830;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff1b0);
        local_108 = local_830;
        local_110 = local_130;
        local_118 = local_138;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff1b0,
                   in_stack_fffffffffffff1a8,(cpp_dec_float<50U,_int,_void> *)0x425431);
      }
      local_1e8 = &local_530;
      local_1f0 = local_830;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff1b0,
                 in_stack_fffffffffffff1a8);
    }
    else {
      local_2d0 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::rhs(in_stack_fffffffffffff1b0,i_00);
      local_2c8 = local_8a8;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff1b0,
                 in_stack_fffffffffffff1a8);
      local_8e8 = 0;
      local_320 = local_8e0;
      local_328 = &local_8e8;
      local_330 = 0;
      local_1a8 = local_328;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0);
      feastol(in_stack_fffffffffffff1e8);
      bVar1 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (in_stack_fffffffffffff230,in_stack_fffffffffffff228,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220));
      bVar8 = true;
      if (!bVar1) {
        local_2c0 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::lhs(in_stack_fffffffffffff1b0,(int)((ulong)in_stack_fffffffffffff1a8 >> 0x20))
        ;
        local_2b8 = local_958;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff1b0,
                   in_stack_fffffffffffff1a8);
        local_998 = 0;
        local_308 = local_990;
        local_310 = &local_998;
        local_318 = 0;
        local_1b0 = local_310;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  (in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0);
        feastol(in_stack_fffffffffffff1e8);
        bVar8 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (in_stack_fffffffffffff1f0,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)in_stack_fffffffffffff1e8,in_stack_fffffffffffff1e0);
      }
      if (bVar8 != false) {
        SPxOut::
        debug<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[13],_0>
                  (in_RDI,(char (*) [13])0x48c1a0);
        return INFEASIBLE;
      }
      in_stack_fffffffffffff227 = 0;
    }
  }
  local_2a8 = local_a08;
  local_2b0 = &local_4ec;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff1b0,in_stack_fffffffffffff1a8);
  epsZero(in_stack_fffffffffffff1e8);
  bVar1 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
                     in_stack_fffffffffffff218);
  if (bVar1) {
    local_a48[0] = 0;
    local_20 = &local_4ec;
    local_28 = local_a48;
    local_18 = local_28;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              (in_stack_fffffffffffff238,(double)in_stack_fffffffffffff230);
  }
  local_298 = local_a80;
  local_2a0 = &local_530;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff1b0,in_stack_fffffffffffff1a8);
  epsZero(in_stack_fffffffffffff1e8);
  bVar1 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
                     in_stack_fffffffffffff218);
  if (bVar1) {
    local_ac0[0]._0_4_ = cpp_dec_float_finite;
    local_ac0[0]._4_4_ = 0;
    local_38 = &local_530;
    local_40 = local_ac0;
    local_30 = local_40;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              (in_stack_fffffffffffff238,(double)in_stack_fffffffffffff230);
  }
  pnVar5 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ::lower(in_stack_fffffffffffff1b0,(int)((ulong)in_stack_fffffffffffff1a8 >> 0x20));
  pnVar6 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ::upper(in_stack_fffffffffffff1b0,(int)((ulong)in_stack_fffffffffffff1a8 >> 0x20));
  SPxOut::
  debug<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[39],_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_&,_const_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_&,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_&,_const_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_&,_0>
            (in_RDI,(char (*) [39])" removed, lower={} ({}) upper={} ({})\n",&local_4ec,pnVar5,
             &local_530,pnVar6);
  local_ac1 = 0;
  local_ac2 = 0;
  local_290 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::lower(in_stack_fffffffffffff1b0,(int)((ulong)in_stack_fffffffffffff1a8 >> 0x20));
  local_288 = local_afc;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff1b0,in_stack_fffffffffffff1a8);
  local_280 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::upper(in_stack_fffffffffffff1b0,(int)((ulong)in_stack_fffffffffffff1a8 >> 0x20));
  local_278 = local_b34;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff1b0,in_stack_fffffffffffff1a8);
  local_268 = local_b6c;
  local_270 = &local_530;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff1b0,in_stack_fffffffffffff1a8);
  local_260 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::upper(in_stack_fffffffffffff1b0,(int)((ulong)in_stack_fffffffffffff1a8 >> 0x20));
  local_258 = local_ba4;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff1b0,in_stack_fffffffffffff1a8);
  feastol(in_stack_fffffffffffff1e8);
  bVar1 = LTrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)in_stack_fffffffffffff2a0,
                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)in_stack_fffffffffffff298,
                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)CONCAT44(in_stack_fffffffffffff294,in_stack_fffffffffffff290));
  if (bVar1) {
    (**(code **)(*local_468 + 0x168))(local_468,local_4b4,&local_530,0);
    local_ac1 = 1;
  }
  local_248 = local_c14;
  local_250 = &local_4ec;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff1b0,in_stack_fffffffffffff1a8);
  local_240 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::lower(in_stack_fffffffffffff1b0,(int)((ulong)in_stack_fffffffffffff1a8 >> 0x20));
  local_238 = local_c4c;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff1b0,in_stack_fffffffffffff1a8);
  feastol(in_stack_fffffffffffff1e8);
  bVar1 = GTrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (in_stack_fffffffffffff270,in_stack_fffffffffffff268,
                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)CONCAT17(in_stack_fffffffffffff267,in_stack_fffffffffffff260));
  if (bVar1) {
    (**(code **)(*local_468 + 0x150))(local_468,local_4b4,&local_4ec,0);
    local_ac2 = 1;
  }
  operator_new(0x218);
  local_230 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::lower(in_stack_fffffffffffff1b0,(int)((ulong)in_stack_fffffffffffff1a8 >> 0x20));
  local_228 = local_cd0;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff1b0,in_stack_fffffffffffff1a8);
  local_220 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::upper(in_stack_fffffffffffff1b0,(int)((ulong)in_stack_fffffffffffff1a8 >> 0x20));
  this_00 = local_d14;
  local_218 = this_00;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff1b0,in_stack_fffffffffffff1a8);
  lp_00 = (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)&stack0xfffffffffffff2b4;
  local_210 = local_afc;
  local_208 = lp_00;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff1b0,in_stack_fffffffffffff1a8);
  this_01 = (SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)&stack0xfffffffffffff27c;
  local_200 = local_b34;
  local_1f8 = this_01;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff1b0,in_stack_fffffffffffff1a8);
  std::shared_ptr<soplex::Tolerances>::shared_ptr
            ((shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffff1b0,
             (shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffff1a8);
  __p = (RowSingletonPS *)local_cd0;
  RowSingletonPS::RowSingletonPS
            (in_stack_fffffffffffff2a0,in_stack_fffffffffffff298,in_stack_fffffffffffff294,
             in_stack_fffffffffffff290,(bool)in_stack_fffffffffffff28f,
             (bool)in_stack_fffffffffffff28e,in_stack_fffffffffffff340,
             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)in_stack_fffffffffffff348,
             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)in_stack_fffffffffffff350._M_pi,in_stack_fffffffffffff358,in_stack_fffffffffffff360)
  ;
  std::
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep>
  ::
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::RowSingletonPS,void>
            ((shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
              *)this_00,__p);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x425c6b);
  Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
  ::append(this_00,(shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                    *)__p);
  removeRow(this_01,lp_00,(int)((ulong)this_00 >> 0x20));
  (in_RDI->
  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).m_remRows = (in_RDI->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).m_remRows + 1;
  (in_RDI->
  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).m_remNzos = (in_RDI->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).m_remNzos + 1;
  piVar7 = DataArray<int>::operator[](&in_RDI->m_stat,2);
  *piVar7 = *piVar7 + 1;
  local_454 = OKAY;
  std::
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ::~shared_ptr((shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                 *)0x425cf4);
  return local_454;
}

Assistant:

typename SPxSimplifier<R>::Result SPxMainSM<R>::removeRowSingleton(SPxLPBase<R>& lp,
      const SVectorBase<R>& row, int& i)
{
   assert(row.size() == 1);

   R aij = row.value(0);
   int  j   = row.index(0);
   R lo  = R(-infinity);
   R up  =  R(infinity);

   SPxOut::debug(this, "IMAISM22 row {}: singleton -> val={} lhs={} rhs={}", i, aij, lp.lhs(i),
                 lp.rhs(i));

   if(GT(aij, R(0.0), this->epsZero()))            // aij > 0
   {
      lo = (lp.lhs(i) <= R(-infinity)) ? R(-infinity) : lp.lhs(i) / aij;
      up = (lp.rhs(i) >=  R(infinity)) ?  R(infinity) : lp.rhs(i) / aij;
   }
   else if(LT(aij, R(0.0), this->epsZero()))       // aij < 0
   {
      lo = (lp.rhs(i) >=  R(infinity)) ? R(-infinity) : lp.rhs(i) / aij;
      up = (lp.lhs(i) <= R(-infinity)) ?  R(infinity) : lp.lhs(i) / aij;
   }
   else if(LT(lp.rhs(i), R(0.0), feastol()) || GT(lp.lhs(i), R(0.0), feastol()))
   {
      // aij == 0, rhs < 0 or lhs > 0
      SPxOut::debug(this, " infeasible\n");
      return this->INFEASIBLE;
   }

   if(isZero(lo, this->epsZero()))
      lo = 0.0;

   if(isZero(up, this->epsZero()))
      up = 0.0;

   SPxOut::debug(this, " removed, lower={} ({}) upper={} ({})\n", lo, lp.lower(j), up, lp.upper(j));

   bool stricterUp = false;
   bool stricterLo = false;

   R oldLo = lp.lower(j);
   R oldUp = lp.upper(j);

   if(LTrel(up, lp.upper(j), feastol()))
   {
      lp.changeUpper(j, up);
      stricterUp = true;
   }

   if(GTrel(lo, lp.lower(j), feastol()))
   {
      lp.changeLower(j, lo);
      stricterLo = true;
   }

   std::shared_ptr<PostStep> ptr(new RowSingletonPS(lp, i, j, stricterLo, stricterUp,
                                 lp.lower(j),
                                 lp.upper(j), oldLo, oldUp, this->_tolerances));
   m_hist.append(ptr);

   removeRow(lp, i);

   this->m_remRows++;
   this->m_remNzos++;
   ++m_stat[SINGLETON_ROW];

   return this->OKAY;
}